

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O3

void amrex_mempool_init(void)

{
  long *plVar1;
  CArena *this;
  void *__s;
  ArenaInfo info;
  ParmParse pp;
  string local_88;
  ParmParse local_68;
  
  if ((anonymous_namespace)::initialized == '\0') {
    (anonymous_namespace)::initialized = '\x01';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"fab","");
    amrex::ParmParse::ParmParse(&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    amrex::ParmParse::queryAdd<int,_0>(&local_68,"init_snan",&(anonymous_namespace)::init_snan);
    std::
    vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
              *)&(anonymous_namespace)::the_memory_pool,1);
    this = (CArena *)operator_new(0xd8);
    info.use_cpu_memory = true;
    info.device_use_managed_memory = false;
    info.device_set_readonly = false;
    info.device_set_preferred = false;
    info.device_use_hostalloc = false;
    info._13_3_ = 0;
    info.release_threshold = 0x7fffffffffffffff;
    amrex::CArena::CArena(this,0,info);
    plVar1 = (long *)*(anonymous_namespace)::the_memory_pool;
    *(anonymous_namespace)::the_memory_pool = (long)this;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    __s = amrex::CArena::alloc((CArena *)*(anonymous_namespace)::the_memory_pool,0x800000);
    memset(__s,0,0x800000);
    amrex::CArena::free((CArena *)*(anonymous_namespace)::the_memory_pool,__s);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  }
  return;
}

Assistant:

void amrex_mempool_init ()
{
    if (!initialized)
    {
        initialized = true;

        ParmParse pp("fab");
        pp.queryAdd("init_snan", init_snan);

        int nthreads = OpenMP::get_max_threads();

        the_memory_pool.resize(nthreads);
        for (int i=0; i<nthreads; ++i) {
            the_memory_pool[i] = std::make_unique<CArena>(0, ArenaInfo().SetCpuMemory());
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel num_threads(nthreads)
#endif
        {
            size_t N = 1024*1024*sizeof(double);
            void *p = amrex_mempool_alloc(N);
            memset(p, 0, N);
            amrex_mempool_free(p);
        }

#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("MemPool", std::function<MemProfiler::MemInfo()>
                         ([] () -> MemProfiler::MemInfo {
                             int MB_min, MB_max, MB_tot;
                             amrex_mempool_get_stats(MB_min, MB_max, MB_tot);
                             Long b = MB_tot * (1024L*1024L);
                             return {b, b};
                         }));
#endif
    }
}